

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall
icu_63::MessagePattern::parsePluralOrSelectStyle
          (MessagePattern *this,UMessagePatternArgType argType,int32_t index,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int8_t iVar4;
  char16_t cVar5;
  int32_t iVar6;
  int32_t iVar7;
  int iVar8;
  int32_t iVar9;
  int32_t valueIndex;
  int32_t length_1;
  int32_t length;
  int32_t selectorIndex;
  UBool eos;
  UBool hasOther;
  UBool isEmpty;
  int32_t start;
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  int32_t local_20;
  int32_t nestingLevel_local;
  int32_t index_local;
  UMessagePatternArgType argType_local;
  MessagePattern *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 != '\0') {
    return 0;
  }
  bVar1 = true;
  bVar2 = false;
  local_20 = index;
  do {
    while( true ) {
      iVar6 = skipWhiteSpace(this,local_20);
      iVar7 = icu_63::UnicodeString::length(&this->msg);
      if ((iVar6 == iVar7) ||
         (cVar5 = icu_63::UnicodeString::charAt(&this->msg,iVar6), cVar5 == L'}')) {
        UVar3 = inMessageFormatPattern(this,nestingLevel);
        if ((iVar6 == iVar7) == (bool)UVar3) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          return 0;
        }
        if (bVar2) {
          return iVar6;
        }
        setParseError(this,parseError,0);
        *errorCode = U_DEFAULT_KEYWORD_MISSING;
        return 0;
      }
      if (((argType != UMSGPAT_ARG_TYPE_PLURAL) && (argType != UMSGPAT_ARG_TYPE_SELECTORDINAL)) ||
         (cVar5 = icu_63::UnicodeString::charAt(&this->msg,iVar6), cVar5 != L'=')) break;
      local_20 = skipDouble(this,iVar6 + 1);
      iVar8 = local_20 - iVar6;
      if (iVar8 == 1) {
        setParseError(this,parseError,index);
        *errorCode = U_PATTERN_SYNTAX_ERROR;
        return 0;
      }
      if (0xffff < iVar8) {
        setParseError(this,parseError,iVar6);
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
      addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,iVar6,iVar8,0,errorCode);
      parseDouble(this,iVar6 + 1,local_20,'\0',parseError,errorCode);
LAB_003f3683:
      UVar3 = ::U_FAILURE(*errorCode);
      if (UVar3 != '\0') {
        return 0;
      }
      iVar7 = skipWhiteSpace(this,local_20);
      iVar9 = icu_63::UnicodeString::length(&this->msg);
      if ((iVar7 == iVar9) ||
         (cVar5 = icu_63::UnicodeString::charAt(&this->msg,iVar7), cVar5 != L'{')) {
        setParseError(this,parseError,iVar6);
        *errorCode = U_PATTERN_SYNTAX_ERROR;
        return 0;
      }
      local_20 = parseMessage(this,iVar7,1,nestingLevel + 1,argType,parseError,errorCode);
      UVar3 = ::U_FAILURE(*errorCode);
      if (UVar3 != '\0') {
        return 0;
      }
      bVar1 = false;
    }
    local_20 = skipIdentifier(this,iVar6);
    iVar8 = local_20 - iVar6;
    if (iVar8 == 0) {
      setParseError(this,parseError,index);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      return 0;
    }
    if (((argType != UMSGPAT_ARG_TYPE_PLURAL) && (argType != UMSGPAT_ARG_TYPE_SELECTORDINAL)) ||
       ((iVar8 != 6 ||
        ((iVar7 = icu_63::UnicodeString::length(&this->msg), iVar7 <= local_20 ||
         (iVar4 = icu_63::UnicodeString::compare(&this->msg,iVar6,7,(char16_t *)kOffsetColon,0,7),
         iVar4 != '\0')))))) {
      if (0xffff < iVar8) {
        setParseError(this,parseError,iVar6);
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
      addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,iVar6,iVar8,0,errorCode);
      iVar4 = icu_63::UnicodeString::compare(&this->msg,iVar6,iVar8,(char16_t *)kOther,0,5);
      if (iVar4 == '\0') {
        bVar2 = true;
      }
      goto LAB_003f3683;
    }
    if (!bVar1) {
      setParseError(this,parseError,index);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      return 0;
    }
    iVar6 = skipWhiteSpace(this,local_20 + 1);
    local_20 = skipDouble(this,iVar6);
    if (local_20 == iVar6) {
      setParseError(this,parseError,index);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      return 0;
    }
    if (0xffff < local_20 - iVar6) {
      setParseError(this,parseError,iVar6);
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    parseDouble(this,iVar6,local_20,'\0',parseError,errorCode);
    UVar3 = ::U_FAILURE(*errorCode);
    if (UVar3 != '\0') {
      return 0;
    }
    bVar1 = false;
  } while( true );
}

Assistant:

int32_t
MessagePattern::parsePluralOrSelectStyle(UMessagePatternArgType argType,
                                         int32_t index, int32_t nestingLevel,
                                         UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    UBool isEmpty=TRUE;
    UBool hasOther=FALSE;
    for(;;) {
        // First, collect the selector looking for a small set of terminators.
        // It would be a little faster to consider the syntax of each possible
        // token right here, but that makes the code too complicated.
        index=skipWhiteSpace(index);
        UBool eos=index==msg.length();
        if(eos || msg.charAt(index)==u_rightCurlyBrace) {
            if(eos==inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(!hasOther) {
                setParseError(parseError, 0);  // Missing 'other' keyword in plural/select pattern.
                errorCode=U_DEFAULT_KEYWORD_MISSING;
                return 0;
            }
            return index;
        }
        int32_t selectorIndex=index;
        if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && msg.charAt(selectorIndex)==u_equal) {
            // explicit-value plural selector: =double
            index=skipDouble(index+1);
            int32_t length=index-selectorIndex;
            if(length==1) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(length>Part::MAX_LENGTH) {
                setParseError(parseError, selectorIndex);  // Argument selector too long.
                errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
            parseDouble(selectorIndex+1, index, FALSE,
                        parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        } else {
            index=skipIdentifier(index);
            int32_t length=index-selectorIndex;
            if(length==0) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // Note: The ':' in "offset:" is just beyond the skipIdentifier() range.
            if( UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && length==6 && index<msg.length() &&
                0==msg.compare(selectorIndex, 7, kOffsetColon, 0, 7)
            ) {
                // plural offset, not a selector
                if(!isEmpty) {
                    // Plural argument 'offset:' (if present) must precede key-message pairs.
                    setParseError(parseError, start);
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                // allow whitespace between offset: and its value
                int32_t valueIndex=skipWhiteSpace(index+1);  // The ':' is at index.
                index=skipDouble(valueIndex);
                if(index==valueIndex) {
                    setParseError(parseError, start);  // Missing value for plural 'offset:'.
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                if((index-valueIndex)>Part::MAX_LENGTH) {
                    setParseError(parseError, valueIndex);  // Plural offset value too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                parseDouble(valueIndex, index, FALSE,
                            parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
                if(U_FAILURE(errorCode)) {
                    return 0;
                }
                isEmpty=FALSE;
                continue;  // no message fragment after the offset
            } else {
                // normal selector word
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, selectorIndex);  // Argument selector too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
                if(0==msg.compare(selectorIndex, length, kOther, 0, 5)) {
                    hasOther=TRUE;
                }
            }
        }
        if(U_FAILURE(errorCode)) {
            return 0;
        }

        // parse the message fragment following the selector
        index=skipWhiteSpace(index);
        if(index==msg.length() || msg.charAt(index)!=u_leftCurlyBrace) {
            setParseError(parseError, selectorIndex);  // No message fragment after plural/select selector.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        index=parseMessage(index, 1, nestingLevel+1, argType, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        isEmpty=FALSE;
    }
}